

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1513.c
# Opt level: O2

int progressKiller(void *arg,double dltotal,double dlnow,double ultotal,double ulnow)

{
  curl_mprintf("PROGRESSFUNCTION called\n");
  return 1;
}

Assistant:

static int progressKiller(void *arg,
                          double dltotal,
                          double dlnow,
                          double ultotal,
                          double ulnow)
{
  (void)arg;
  (void)dltotal;
  (void)dlnow;
  (void)ultotal;
  (void)ulnow;
  printf("PROGRESSFUNCTION called\n");
  return 1;
}